

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O0

int Msat_OrderVarSelect(Msat_Order_t *p)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  abctime clk;
  int Var;
  Msat_Order_t *p_local;
  
  aVar2 = Abc_Clock();
  do {
    if (p->vHeap->nSize == 1) {
      return -3;
    }
    iVar1 = Msat_HeapGetTop(p);
  } while (p->pSat->pAssigns[iVar1] != -1);
  aVar3 = Abc_Clock();
  timeSelect = (aVar3 - aVar2) + timeSelect;
  return iVar1;
}

Assistant:

int Msat_OrderVarSelect( Msat_Order_t * p )
{
    // Activity based decision:
//    while (!heap.empty()){
//        Var next = heap.getmin();
//        if (toLbool(assigns[next]) == l_Undef)
//            return next;
//    }
//    return var_Undef;

    int Var;
    abctime clk = Abc_Clock();

    while ( !HEMPTY(p) )
    {
        Var = Msat_HeapGetTop(p);
        if ( (p)->pSat->pAssigns[Var] == MSAT_VAR_UNASSIGNED )
        {
//assert( Msat_OrderCheck(p) );
timeSelect += Abc_Clock() - clk;
            return Var;
        }
    }
    return MSAT_ORDER_UNKNOWN;
}